

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void duckdb::Prefix::Concat
               (ART *art,Node *parent,uint8_t byte,GateStatus old_status,Node *child,
               GateStatus status)

{
  ulong uVar1;
  Node other;
  undefined7 in_register_00000009;
  Prefix tail;
  uint8_t local_69;
  Prefix local_68;
  Prefix local_48;
  
  local_69 = byte;
  if ((int)CONCAT71(in_register_00000009,old_status) == 1) {
    ConcatGate(art,parent,byte,child);
    return;
  }
  uVar1 = (child->super_IndexPointer).data;
  if (-1 < (long)uVar1) {
    if ((uVar1 & 0x7f00000000000000) == 0x700000000000000 && status == GATE_SET) {
      Free(art,parent);
      (parent->super_IndexPointer).data = uVar1;
    }
    else {
      if (((parent->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
        GetTail(&local_68,art,parent);
        Append(&local_48,&local_68,art,local_69);
        local_68.in_memory = local_48.in_memory;
        local_68.data = local_48.data;
        local_68.ptr = local_48.ptr;
      }
      else {
        NewInternal(&local_68,art,parent,&local_69,'\x01',0,PREFIX);
      }
      other.super_IndexPointer.data = (IndexPointer)(child->super_IndexPointer).data;
      if (((ulong)other.super_IndexPointer.data & 0x7f00000000000000) == 0x100000000000000) {
        Append(&local_68,art,other);
      }
      else {
        ((local_68.ptr)->super_IndexPointer).data = (idx_t)other.super_IndexPointer.data;
      }
    }
    return;
  }
  ConcatChildIsGate(art,parent,byte,child);
  return;
}

Assistant:

void Prefix::Concat(ART &art, Node &parent, uint8_t byte, const GateStatus old_status, const Node &child,
                    const GateStatus status) {
	D_ASSERT(!parent.IsAnyLeaf());
	D_ASSERT(child.HasMetadata());

	if (old_status == GateStatus::GATE_SET) {
		// Concat Node4.
		D_ASSERT(status == GateStatus::GATE_SET);
		return ConcatGate(art, parent, byte, child);
	}
	if (child.GetGateStatus() == GateStatus::GATE_SET) {
		// Concat Node4.
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		return ConcatChildIsGate(art, parent, byte, child);
	}

	if (status == GateStatus::GATE_SET && child.GetType() == NType::LEAF_INLINED) {
		auto row_id = child.GetRowId();
		Free(art, parent);
		Leaf::New(parent, row_id);
		return;
	}

	if (parent.GetType() != PREFIX) {
		auto prefix = NewInternal(art, parent, &byte, 1, 0, PREFIX);
		if (child.GetType() == PREFIX) {
			prefix.Append(art, child);
		} else {
			*prefix.ptr = child;
		}
		return;
	}

	auto tail = GetTail(art, parent);
	tail = tail.Append(art, byte);

	if (child.GetType() == PREFIX) {
		tail.Append(art, child);
	} else {
		*tail.ptr = child;
	}
}